

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall Reader::processsossec(Reader *this)

{
  _Rb_tree_header *p_Var1;
  ProcessedToken *pPVar2;
  char *__s;
  char *pcVar3;
  ProcessedToken *pPVar4;
  bool bVar5;
  element_type *peVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  invalid_argument *this_00;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  shared_ptr<SOS> sos;
  LpSectionKeyword this_section_keyword;
  shared_ptr<Variable> var;
  string name;
  value_type local_98;
  key_type local_84;
  undefined1 local_80 [16];
  pair<std::shared_ptr<Variable>,_double> local_70;
  vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_> *local_58;
  __node_base *local_50 [2];
  __node_base local_40 [2];
  
  local_84 = SOS;
  p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < 8]) {
    if (7 < (int)p_Var10[1]._M_color) {
      p_Var9 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) && (p_Var10 = p_Var9, 8 < (int)p_Var9[1]._M_color)) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    pmVar7 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](&this->sectiontokens,&local_84);
    pmVar8 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](&this->sectiontokens,&local_84);
    if ((pmVar7->first)._M_current != (pmVar8->second)._M_current) {
      local_58 = &(this->builder).model.soss;
      do {
        local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0x40);
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name)._M_dataplus.
        _M_p = (pointer)&((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         name).field_2;
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
        _M_string_length = 0;
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).field_2.
        _M_local_buf[0] = '\0';
        (local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = 0;
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->entries).
        super__Vector_base<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->entries).
        super__Vector_base<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->entries).
        super__Vector_base<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SOS*>
                  (&local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        peVar6 = local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pPVar2 = (pmVar7->first)._M_current;
        if (pPVar2->type != CONID) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"File not existent or illegal file format.");
LAB_001e1079:
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        __s = (pPVar2->field_1).name;
        pcVar3 = (char *)((local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         name)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)peVar6,0,pcVar3,(ulong)__s);
        pPVar4 = (pmVar7->first)._M_current;
        pPVar2 = pPVar4 + 1;
        (pmVar7->first)._M_current = pPVar2;
        if (pPVar2 == (pmVar8->second)._M_current) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"File not existent or illegal file format.");
          goto LAB_001e1079;
        }
        if (pPVar2->type != SOSTYPE) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"File not existent or illegal file format.");
          goto LAB_001e1079;
        }
        (local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type =
             2 - (ushort)(pPVar4[1].field_1.keyword == NONE);
        (pmVar7->first)._M_current = pPVar4 + 2;
        do {
          pPVar2 = (pmVar7->first)._M_current;
          if ((pPVar2 == (pmVar8->second)._M_current) || (pPVar2->type != CONID)) break;
          std::__cxx11::string::string
                    ((string *)local_50,(((pmVar7->first)._M_current)->field_1).name,
                     (allocator *)(local_80 + 0x10));
          pPVar2 = (pmVar7->first)._M_current;
          if ((pPVar2 + 1 == (pmVar8->second)._M_current) || (pPVar2[1].type != CONST)) {
            bVar5 = false;
          }
          else {
            Builder::getvarbyname((Builder *)local_80,(string *)&this->builder);
            local_70.second = *(double *)&pPVar2[1].field_1;
            local_70.first.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_80._0_8_;
            local_70.first.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_80._8_8_ + 8) = *(_Atomic_word *)(local_80._8_8_ + 8) + 1;
              }
            }
            std::
            vector<std::pair<std::shared_ptr<Variable>,double>,std::allocator<std::pair<std::shared_ptr<Variable>,double>>>
            ::emplace_back<std::pair<std::shared_ptr<Variable>,double>>
                      ((vector<std::pair<std::shared_ptr<Variable>,double>,std::allocator<std::pair<std::shared_ptr<Variable>,double>>>
                        *)&(local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           entries,(pair<std::shared_ptr<Variable>,_double> *)(local_80 + 0x10));
            if (local_70.first.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70.first.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            (pmVar7->first)._M_current = pPVar2 + 2;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
            }
            bVar5 = true;
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        } while (bVar5);
        std::vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>::push_back
                  (local_58,&local_98);
        if (local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ;
        }
      } while ((pmVar7->first)._M_current != (pmVar8->second)._M_current);
    }
  }
  return;
}

Assistant:

void Reader::processsossec() {
  const LpSectionKeyword this_section_keyword = LpSectionKeyword::SOS;
  if (!sectiontokens.count(this_section_keyword)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[this_section_keyword].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[this_section_keyword].second);
  while (begin != end) {
    std::shared_ptr<SOS> sos = std::shared_ptr<SOS>(new SOS);

    // sos1: S1 :: x1 : 1  x2 : 2  x3 : 3

    // name of SOS is mandatory
    lpassert(begin->type == ProcessedTokenType::CONID);
    sos->name = begin->name;
    ++begin;

    // SOS type
    lpassert(begin != end);
    lpassert(begin->type == ProcessedTokenType::SOSTYPE);
    sos->type = begin->sostype == SosType::SOS1 ? 1 : 2;
    ++begin;

    while (begin != end) {
      // process all "var : weight" entries
      // when processtokens() sees a string followed by a colon, it classifies
      // this as a CONID but in a SOS section, this is actually a variable
      // identifier
      if (begin->type != ProcessedTokenType::CONID) break;
      std::string name = begin->name;
      std::vector<ProcessedToken>::iterator next = begin;
      ++next;
      if (next != end && next->type == ProcessedTokenType::CONST) {
        auto var = builder.getvarbyname(name);
        double weight = next->value;

        sos->entries.push_back({var, weight});

        begin = ++next;
        continue;
      }

      break;
    }

    builder.model.soss.push_back(sos);
  }
}